

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-type.c
# Opt level: O3

void coda_type_release(coda_type *type)

{
  coda_ascii_mapping *mapping;
  int iVar1;
  void *__ptr;
  char *__ptr_00;
  long lVar2;
  
  if (type == (coda_type *)0x0) {
switchD_0016121a_default:
    return;
  }
  if (0 < type->retain_count) {
    type->retain_count = type->retain_count + -1;
    return;
  }
  switch(type->type_class) {
  case coda_record_class:
    record_delete((coda_type_record *)type);
    return;
  case coda_array_class:
    if (type->name != (char *)0x0) {
      free(type->name);
    }
    if (type->description != (char *)0x0) {
      free(type->description);
    }
    if (type->size_expr != (coda_expression *)0x0) {
      coda_expression_delete(type->size_expr);
    }
    if (type->attributes != (coda_type_record *)0x0) {
      coda_type_release((coda_type *)type->attributes);
    }
    if (*(coda_type **)(type + 1) != (coda_type *)0x0) {
      coda_type_release(*(coda_type **)(type + 1));
    }
    iVar1 = *(int *)&type[1].name;
    if (0 < iVar1) {
      lVar2 = 0;
      do {
        if ((coda_expression *)(&type[2].bit_size)[lVar2] != (coda_expression *)0x0) {
          coda_expression_delete((coda_expression *)(&type[2].bit_size)[lVar2]);
          iVar1 = *(int *)&type[1].name;
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < iVar1);
    }
    goto LAB_001613a6;
  case coda_integer_class:
  case coda_real_class:
    if (type->name != (char *)0x0) {
      free(type->name);
    }
    if (type->description != (char *)0x0) {
      free(type->description);
    }
    if (type->size_expr != (coda_expression *)0x0) {
      coda_expression_delete(type->size_expr);
    }
    if (type->attributes != (coda_type_record *)0x0) {
      coda_type_release((coda_type *)type->attributes);
    }
    if (*(void **)(type + 1) != (void *)0x0) {
      free(*(void **)(type + 1));
    }
    if ((coda_conversion *)type[1].name != (coda_conversion *)0x0) {
      coda_conversion_delete((coda_conversion *)type[1].name);
    }
    __ptr_00 = type[1].description;
    if (__ptr_00 == (char *)0x0) goto LAB_001613a6;
    __ptr = *(void **)(__ptr_00 + 0x10);
    if (__ptr != (void *)0x0) {
      iVar1 = *(int *)(__ptr_00 + 8);
      if (0 < iVar1) {
        lVar2 = 0;
        do {
          mapping = *(coda_ascii_mapping **)(*(long *)(__ptr_00 + 0x10) + lVar2 * 8);
          if (mapping != (coda_ascii_mapping *)0x0) {
            mapping_delete(mapping);
            iVar1 = *(int *)(__ptr_00 + 8);
          }
          lVar2 = lVar2 + 1;
        } while (lVar2 < iVar1);
        __ptr = *(void **)(__ptr_00 + 0x10);
      }
      free(__ptr);
    }
    break;
  case coda_text_class:
    if (type->name != (char *)0x0) {
      free(type->name);
    }
    if (type->description != (char *)0x0) {
      free(type->description);
    }
    if (type->size_expr != (coda_expression *)0x0) {
      coda_expression_delete(type->size_expr);
    }
    if (type->attributes != (coda_type_record *)0x0) {
      coda_type_release((coda_type *)type->attributes);
    }
    __ptr_00 = *(char **)(type + 1);
    if (__ptr_00 == (char *)0x0) goto LAB_001613a6;
    break;
  case coda_raw_class:
    raw_delete((coda_type_raw *)type);
    return;
  case coda_special_class:
    special_delete((coda_type_special *)type);
    return;
  default:
    goto switchD_0016121a_default;
  }
  free(__ptr_00);
LAB_001613a6:
  free(type);
  return;
}

Assistant:

void coda_type_release(coda_type *type)
{
    if (type == NULL)
    {
        return;
    }

    if (type->retain_count > 0)
    {
        type->retain_count--;
        return;
    }

    switch (type->type_class)
    {
        case coda_record_class:
            record_delete((coda_type_record *)type);
            break;
        case coda_array_class:
            array_delete((coda_type_array *)type);
            break;
        case coda_integer_class:
        case coda_real_class:
            number_delete((coda_type_number *)type);
            break;
        case coda_text_class:
            text_delete((coda_type_text *)type);
            break;
        case coda_raw_class:
            raw_delete((coda_type_raw *)type);
            break;
        case coda_special_class:
            special_delete((coda_type_special *)type);
            break;
    }
}